

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall
SSTable::toSSTable(SSTable *this,SSTableDic *dic,string *fileName,uint64_t timeStamp)

{
  _WordT _Var1;
  _WordT _Var2;
  undefined8 *puVar3;
  long lVar4;
  runtime_error *this_00;
  long *plVar5;
  _WordT *p_Var6;
  void *__buf;
  SSTableDic *__range1;
  int iVar7;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  undefined8 *puVar8;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_1;
  long lVar9;
  ofstream out;
  BloomFilter bloomFilter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a50;
  long local_2a30;
  filebuf local_2a28 [24];
  byte abStack_2a10 [216];
  ios_base local_2938 [264];
  BloomFilter local_2830;
  
  std::ofstream::ofstream(&local_2a30,(string *)dic,_S_trunc|_S_out|_S_bin);
  if ((abStack_2a10[*(long *)(local_2a30 + -0x18)] & 5) == 0) {
    p_Var6 = *(_WordT **)this;
    lVar9 = *(long *)(this + 8);
    _Var1 = *p_Var6;
    _Var2 = *(_WordT *)(lVar9 + -0x28);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = (_WordT)fileName;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] =
         (lVar9 - (long)p_Var6 >> 3) * -0x3333333333333333;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = _Var1;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = _Var2;
    std::ostream::write((char *)&local_2a30,(long)&local_2830);
    BloomFilter::BloomFilter(&local_2830,(SSTableDic *)this);
    BloomFilter::write(&local_2830,(int)&local_2a30,__buf,timeStamp);
    puVar8 = *(undefined8 **)this;
    puVar3 = *(undefined8 **)(this + 8);
    iVar7 = 0;
    if (puVar8 != puVar3) {
      do {
        local_2a50._M_dataplus._M_p = (pointer)*puVar8;
        std::ostream::write((char *)&local_2a30,(long)&local_2a50);
        local_2a50._M_dataplus._M_p._0_4_ = iVar7;
        std::ostream::write((char *)&local_2a30,(long)&local_2a50);
        iVar7 = iVar7 + *(int *)(puVar8 + 2);
        puVar8 = puVar8 + 5;
      } while (puVar8 != puVar3);
    }
    local_2a50._M_dataplus._M_p = (pointer)0x0;
    std::ostream::write((char *)&local_2a30,(long)&local_2a50);
    local_2a50._M_dataplus._M_p._0_4_ = iVar7;
    std::ostream::write((char *)&local_2a30,(long)&local_2a50);
    lVar9 = *(long *)this;
    lVar4 = *(long *)(this + 8);
    if (lVar9 != lVar4) {
      do {
        std::ostream::write((char *)&local_2a30,*(long *)(lVar9 + 8));
        lVar9 = lVar9 + 0x28;
      } while (lVar9 != lVar4);
    }
    std::ofstream::close();
    local_2a30 = _VTT;
    *(undefined8 *)(local_2a28 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_2a28);
    std::ios_base::~ios_base(local_2938);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2a50,"toSSTable(dic): Open file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dic);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a50);
  local_2830.bits.super__Base_bitset<1280UL>._M_w[0] = *plVar5;
  p_Var6 = (_WordT *)(plVar5 + 2);
  if ((_WordT *)local_2830.bits.super__Base_bitset<1280UL>._M_w[0] == p_Var6) {
    local_2830.bits.super__Base_bitset<1280UL>._M_w[2] = *p_Var6;
    local_2830.bits.super__Base_bitset<1280UL>._M_w[3] = plVar5[3];
    local_2830.bits.super__Base_bitset<1280UL>._M_w[0] =
         (_WordT)(local_2830.bits.super__Base_bitset<1280UL>._M_w + 2);
  }
  else {
    local_2830.bits.super__Base_bitset<1280UL>._M_w[2] = *p_Var6;
  }
  local_2830.bits.super__Base_bitset<1280UL>._M_w[1] = plVar5[1];
  *plVar5 = (long)p_Var6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_2830);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::toSSTable(const SSTableDic &dic, const string &fileName,
                        uint64_t timeStamp) {
  ofstream out(fileName, ios::out | ios::binary | ios::trunc);
  if (out.fail())
    throw runtime_error("toSSTable(dic): Open file " + fileName + " failed!");

  auto length = dic.size();
  auto min = dic[0].first;
  auto max = dic.back().first;

  // Header
  write64(out, timeStamp);
  write64(out, length);
  write64(out, min);
  write64(out, max);

  // BloomFilter
  BloomFilter bloomFilter(dic);
  bloomFilter.write(out);

  // Key, Offset
  uint32_t offset = 0;
  for (const auto &pair : dic) {
    write64(out, pair.first);
    write32(out, offset);
    offset += pair.second.size();
  }
  write64(out, 0);
  write32(out, offset);

  // Value
  for (const auto &pair : dic) {
    out.write(pair.second.c_str(), (long)pair.second.size());
  }

  out.close();
}